

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_any.hpp
# Opt level: O2

any * __thiscall iutest::any::operator=(any *this,int *rhs)

{
  placeholder *ppVar1;
  placeholder *in_RAX;
  any local_18;
  
  local_18.content = in_RAX;
  any<int>(&local_18,rhs);
  ppVar1 = this->content;
  this->content = (placeholder *)local_18;
  if (ppVar1 != (placeholder *)0x0) {
    local_18.content = ppVar1;
    (*ppVar1->_vptr_placeholder[1])();
  }
  return this;
}

Assistant:

any& operator = (const   T& rhs) { any(rhs).swap(*this); return *this; }